

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon_entropy.cc
# Opt level: O2

int64_t draco::ComputeShannonEntropy
                  (uint32_t *symbols,int num_symbols,int max_value,int *out_num_unique_symbols)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  undefined8 uVar6;
  vector<int,_std::allocator<int>_> symbol_frequencies;
  allocator_type local_69;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  value_type_conflict1 local_44;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,(long)(max_value + 1),&local_44,
             &local_69);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < num_symbols) {
    uVar2 = (ulong)(uint)num_symbols;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    local_40._M_impl.super__Vector_impl_data._M_start[symbols[uVar1]] =
         local_40._M_impl.super__Vector_impl_data._M_start[symbols[uVar1]] + 1;
  }
  local_58 = (double)num_symbols;
  dVar5 = 0.0;
  uVar6 = 0;
  iVar3 = 0;
  for (lVar4 = 0; lVar4 <= max_value; lVar4 = lVar4 + 1) {
    if (0 < local_40._M_impl.super__Vector_impl_data._M_start[lVar4]) {
      iVar3 = iVar3 + 1;
      local_50 = (double)local_40._M_impl.super__Vector_impl_data._M_start[lVar4];
      local_68 = dVar5;
      uStack_60 = uVar6;
      dVar5 = log2(local_50 / local_58);
      dVar5 = local_68 + dVar5 * local_50;
      uVar6 = uStack_60;
      local_68 = dVar5;
    }
  }
  if (out_num_unique_symbols != (int *)0x0) {
    *out_num_unique_symbols = iVar3;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return (long)-dVar5;
}

Assistant:

int64_t ComputeShannonEntropy(const uint32_t *symbols, int num_symbols,
                              int max_value, int *out_num_unique_symbols) {
  // First find frequency of all unique symbols in the input array.
  int num_unique_symbols = 0;
  std::vector<int> symbol_frequencies(max_value + 1, 0);
  for (int i = 0; i < num_symbols; ++i) {
    ++symbol_frequencies[symbols[i]];
  }
  double total_bits = 0;
  double num_symbols_d = num_symbols;
  for (int i = 0; i < max_value + 1; ++i) {
    if (symbol_frequencies[i] > 0) {
      ++num_unique_symbols;
      // Compute Shannon entropy for the symbol.
      // We don't want to use std::log2 here for Android build.
      total_bits +=
          symbol_frequencies[i] *
          log2(static_cast<double>(symbol_frequencies[i]) / num_symbols_d);
    }
  }
  if (out_num_unique_symbols) {
    *out_num_unique_symbols = num_unique_symbols;
  }
  // Entropy is always negative.
  return static_cast<int64_t>(-total_bits);
}